

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O2

void __thiscall
DifferentialEquation::setParameter(DifferentialEquation *this,string *name,string *value)

{
  bool bVar1;
  double d;
  stringstream setting;
  undefined8 local_1a8;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  bVar1 = std::operator==(name,"starting-value");
  if (bVar1) {
    std::operator<<(&local_190,(string *)value);
    std::istream::_M_extract<double>((double *)local_1a0);
    (*(this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric
      [0xf])(local_1a8,this);
  }
  else {
    bVar1 = std::operator==(name,"mode");
    if (bVar1) {
      bVar1 = std::operator==(value,"ito");
      if (bVar1) {
        this->eqnMethodPtr = (offset_in_DifferentialEquation_to_subr)stepEulerIto;
        *(undefined8 *)&this->field_0x158 = 0;
      }
      bVar1 = std::operator==(value,"stratonovitch");
      if (bVar1) {
        this->eqnMethodPtr = (offset_in_DifferentialEquation_to_subr)stepEulerStratonovich;
        *(undefined8 *)&this->field_0x158 = 0;
      }
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void DifferentialEquation::setParameter( const string& name, const string& value )
{
	stringstream setting;
	
	// first value
	if (name=="starting-value") {
		double d;
		setting << value;
		setting >> d;
		init(d);
	}
	
	// mode
	else if (name=="mode") {
		if (value=="ito")
			setIto();
		if (value=="stratonovitch")
			setStratonovich();
	}
}